

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

QVariant * __thiscall
QPlainTextEdit::inputMethodQuery
          (QVariant *__return_storage_ptr__,QPlainTextEdit *this,InputMethodQuery query,
          QVariant argument)

{
  long lVar1;
  long *plVar2;
  QRectF QVar3;
  QRectF QVar4;
  int iVar5;
  TextInteractionFlags TVar6;
  undefined8 uVar7;
  QVariant *in_RCX;
  QPoint QVar8;
  int iVar9;
  QPlainTextEditPrivate *d;
  long in_FS_OFFSET;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  QRect QVar14;
  QRect QVar15;
  QPointF QVar16;
  undefined1 auVar17 [16];
  QPointF QVar18;
  double local_b8;
  double dStack_b0;
  undefined8 local_a8;
  qreal qStack_a0;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((int)query < 0x8000) {
    if (query == ImEnabled) {
      if (((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
           1) == 0) && (*(QWidgetTextControl **)(lVar1 + 800) != (QWidgetTextControl *)0x0)) {
        TVar6 = QWidgetTextControl::textInteractionFlags(*(QWidgetTextControl **)(lVar1 + 800));
        bVar10 = SUB41(((uint)TVar6.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                              super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) >> 4,0);
      }
      else {
        bVar10 = false;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0049aaa3:
        ::QVariant::QVariant(__return_storage_ptr__,bVar10);
        return __return_storage_ptr__;
      }
      goto LAB_0049ae1a;
    }
    if (query == ImHints) goto LAB_0049a91b;
  }
  else {
    if (query == ImInputItemClipRectangle) {
LAB_0049a91b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidget::inputMethodQuery(__return_storage_ptr__,(QWidget *)this,query);
        return __return_storage_ptr__;
      }
      goto LAB_0049ae1a;
    }
    if (query == ImReadOnly) {
      if (*(QWidgetTextControl **)(lVar1 + 800) == (QWidgetTextControl *)0x0) {
        bVar10 = true;
      }
      else {
        TVar6 = QWidgetTextControl::textInteractionFlags(*(QWidgetTextControl **)(lVar1 + 800));
        bVar10 = ((uint)TVar6.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                        super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0049aaa3;
      goto LAB_0049ae1a;
    }
  }
  QVar16 = contentOffset(this);
  dVar12 = QVar16.yp;
  dVar13 = QVar16.xp;
  iVar5 = ::QVariant::typeId(in_RCX);
  switch(iVar5) {
  case 0x13:
    auVar17 = ::QVariant::toRect();
    dVar11 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    bVar10 = 2147483647.0 < dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    iVar5 = (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar11);
    dVar11 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
    bVar10 = 2147483647.0 < dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    iVar9 = (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar11);
    QVar14.x1.m_i = auVar17._0_4_ - iVar5;
    QVar14.y1.m_i = auVar17._4_4_ - iVar9;
    QVar14.y2.m_i = auVar17._12_4_ - iVar9;
    QVar14.x2.m_i = auVar17._8_4_ - iVar5;
    ::QVariant::QVariant((QVariant *)&local_58,QVar14);
    break;
  case 0x14:
    ::QVariant::toRectF();
    QVar3.yp = dStack_b0 - dVar12;
    QVar3.xp = local_b8 - dVar13;
    QVar3.w = (qreal)local_a8;
    QVar3.h = qStack_a0;
    ::QVariant::QVariant((QVariant *)&local_58,QVar3);
    break;
  default:
    goto switchD_0049a977_caseD_15;
  case 0x19:
    uVar7 = ::QVariant::toPoint();
    auVar17._8_8_ = (double)(int)((ulong)uVar7 >> 0x20);
    auVar17._0_8_ = (double)(int)uVar7;
    goto LAB_0049ab3e;
  case 0x1a:
    auVar17 = ::QVariant::toPointF();
LAB_0049ab3e:
    QVar16.xp = auVar17._0_8_ - dVar13;
    QVar16.yp = auVar17._8_8_ - dVar12;
    ::QVariant::QVariant((QVariant *)&local_58,QVar16);
  }
  ::QVariant::operator=(in_RCX,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
switchD_0049a977_caseD_15:
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar2 = *(long **)(lVar1 + 800);
  ::QVariant::QVariant(&local_78,in_RCX);
  (**(code **)(*plVar2 + 0x90))(&local_58,plVar2,query,&local_78);
  ::QVariant::~QVariant(&local_78);
  iVar5 = ::QVariant::typeId((QVariant *)&local_58);
  switch(iVar5) {
  case 0x13:
    auVar17 = ::QVariant::toRect();
    dVar13 = dVar13 + (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000);
    dVar11 = dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    iVar5 = (int)(double)(-(ulong)(2147483647.0 < dVar13) & 0x41dfffffffc00000 |
                         ~-(ulong)(2147483647.0 < dVar13) & (ulong)dVar11);
    dVar12 = dVar12 + (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000);
    dVar13 = dVar12;
    if (dVar12 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    iVar9 = (int)(double)(-(ulong)(2147483647.0 < dVar12) & 0x41dfffffffc00000 |
                         ~-(ulong)(2147483647.0 < dVar12) & (ulong)dVar13);
    QVar15.x1.m_i = auVar17._0_4_ + iVar5;
    QVar15.y1.m_i = auVar17._4_4_ + iVar9;
    QVar15.y2.m_i = auVar17._12_4_ + iVar9;
    QVar15.x2.m_i = iVar5 + auVar17._8_4_;
    ::QVariant::QVariant(__return_storage_ptr__,QVar15);
    break;
  case 0x14:
    ::QVariant::toRectF();
    QVar4.yp = dVar12 + dStack_b0;
    QVar4.xp = dVar13 + local_b8;
    QVar4.w = (qreal)local_a8;
    QVar4.h = qStack_a0;
    ::QVariant::QVariant(__return_storage_ptr__,QVar4);
    break;
  default:
    ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)&local_58);
    break;
  case 0x19:
    uVar7 = ::QVariant::toPoint();
    dVar13 = dVar13 + (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000);
    bVar10 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    QVar8.xp.m_i = (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 |
                                ~-(ulong)bVar10 & (ulong)dVar13) + (int)uVar7;
    dVar12 = dVar12 + (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000);
    bVar10 = 2147483647.0 < dVar12;
    if (dVar12 <= -2147483648.0) {
      dVar12 = -2147483648.0;
    }
    QVar8.yp.m_i = (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 |
                                ~-(ulong)bVar10 & (ulong)dVar12) + (int)((ulong)uVar7 >> 0x20);
    ::QVariant::QVariant(__return_storage_ptr__,QVar8);
    break;
  case 0x1a:
    auVar17 = ::QVariant::toPointF();
    QVar18.xp = auVar17._0_8_ + dVar13;
    QVar18.yp = auVar17._8_8_ + dVar12;
    ::QVariant::QVariant(__return_storage_ptr__,QVar18);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0049ae1a:
  __stack_chk_fail();
}

Assistant:

QVariant QPlainTextEdit::inputMethodQuery(Qt::InputMethodQuery query, QVariant argument) const
{
    Q_D(const QPlainTextEdit);
    switch (query) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImHints:
    case Qt::ImInputItemClipRectangle:
        return QWidget::inputMethodQuery(query);
    case Qt::ImReadOnly:
        return isReadOnly();
    default:
        break;
    }

    const QPointF offset = contentOffset();
    switch (argument.userType()) {
    case QMetaType::QRectF:
        argument = argument.toRectF().translated(-offset);
        break;
    case QMetaType::QPointF:
        argument = argument.toPointF() - offset;
        break;
    case QMetaType::QRect:
        argument = argument.toRect().translated(-offset.toPoint());
        break;
    case QMetaType::QPoint:
        argument = argument.toPoint() - offset;
        break;
    default:
        break;
    }

    const QVariant v = d->control->inputMethodQuery(query, argument);
    switch (v.userType()) {
    case QMetaType::QRectF:
        return v.toRectF().translated(offset);
    case QMetaType::QPointF:
        return v.toPointF() + offset;
    case QMetaType::QRect:
        return v.toRect().translated(offset.toPoint());
    case QMetaType::QPoint:
        return v.toPoint() + offset.toPoint();
    default:
        break;
    }
    return v;
}